

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

StringRef __thiscall
llvm::yaml::ScalarTraits<bool,_void>::input
          (ScalarTraits<bool,_void> *this,StringRef Scalar,void *param_2,bool *Val)

{
  bool bVar1;
  StringRef local_58;
  StringRef local_48;
  undefined1 *local_38;
  bool *Val_local;
  void *param_1_local;
  StringRef Scalar_local;
  
  Val_local = (bool *)Scalar.Length;
  Scalar_local.Data = Scalar.Data;
  local_38 = (undefined1 *)param_2;
  param_1_local = this;
  StringRef::StringRef(&local_48,"true");
  bVar1 = StringRef::equals((StringRef *)&param_1_local,local_48);
  if (bVar1) {
    *local_38 = 1;
    memset(&Scalar_local.Length,0,0x10);
    StringRef::StringRef((StringRef *)&Scalar_local.Length);
  }
  else {
    StringRef::StringRef(&local_58,"false");
    bVar1 = StringRef::equals((StringRef *)&param_1_local,local_58);
    if (bVar1) {
      *local_38 = 0;
      memset(&Scalar_local.Length,0,0x10);
      StringRef::StringRef((StringRef *)&Scalar_local.Length);
    }
    else {
      StringRef::StringRef((StringRef *)&Scalar_local.Length,"invalid boolean");
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

StringRef ScalarTraits<bool>::input(StringRef Scalar, void *, bool &Val) {
  if (Scalar.equals("true")) {
    Val = true;
    return StringRef();
  } else if (Scalar.equals("false")) {
    Val = false;
    return StringRef();
  }
  return "invalid boolean";
}